

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O3

void __thiscall ztimer::TimerManager::Turn(TimerManager *this,uint pos)

{
  int *piVar1;
  key_type *__k;
  int iVar2;
  mapped_type *pmVar3;
  long lVar4;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false> __it;
  Timer *timer;
  Timer *local_90;
  undefined8 local_88;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_80;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_78;
  long local_70;
  undefined8 local_68;
  undefined1 local_60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  undefined1 local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  undefined1 local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_70 = (ulong)pos * 0x38;
  __it._M_cur = (__node_type *)
                (this->timeWheel).
                super__Vector_base<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[pos]._M_h._M_before_begin._M_nxt;
  if (__it._M_cur != (__node_type *)0x0) {
    local_78 = &(this->AbsTimerMap)._M_h;
    local_80 = &(this->timerMap)._M_h;
    do {
      piVar1 = (int *)((long)__it._M_cur + 0x18);
      iVar2 = *piVar1;
      *piVar1 = *piVar1 + -1;
      if (iVar2 == 0) {
        __k = (key_type *)((long)__it._M_cur + 8);
        local_68 = *(undefined8 *)((long)__it._M_cur + 8);
        iVar2 = *(int *)((long)__it._M_cur + 0x10);
        if (iVar2 == 0) {
          local_90 = (Timer *)0x11;
          local_88 = 0;
          std::async<void(ztimer::Timer::*)(),ztimer::Timer*&>
                    ((launch)local_50,(offset_in_Timer_to_subr *)0x1,&local_90);
          if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
          }
          std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_erase(local_80,__k);
LAB_0011c119:
          __it._M_cur = (__node_type *)
                        std::
                        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::erase((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 *)((long)&(((this->timeWheel).
                                             super__Vector_base<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_h).
                                           _M_buckets + local_70),__it._M_cur);
        }
        else if (iVar2 == 2) {
          pmVar3 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)local_78,__k);
          lVar4 = std::chrono::_V2::system_clock::now();
          if ((pmVar3->__d).__r <= lVar4) {
            local_90 = (Timer *)0x11;
            local_88 = 0;
            std::async<void(ztimer::Timer::*)(),ztimer::Timer*&>
                      ((launch)local_60,(offset_in_Timer_to_subr *)0x1,&local_90);
            if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
            }
            std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_erase(local_80,__k);
            std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_erase(local_78,__k);
            goto LAB_0011c119;
          }
          *(undefined4 *)((long)__it._M_cur + 0x18) = *(undefined4 *)((long)__it._M_cur + 0x14);
          __it._M_cur = *__it._M_cur;
        }
        else if (iVar2 == 1) {
          local_90 = (Timer *)0x11;
          local_88 = 0;
          std::async<void(ztimer::Timer::*)(),ztimer::Timer*&>
                    ((launch)local_40,(offset_in_Timer_to_subr *)0x1,&local_90);
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          *(undefined4 *)((long)__it._M_cur + 0x18) = *(undefined4 *)((long)__it._M_cur + 0x14);
          goto LAB_0011c044;
        }
      }
      else {
LAB_0011c044:
        __it._M_cur = *__it._M_cur;
      }
    } while (__it._M_cur != (__node_type *)0x0);
  }
  return;
}

Assistant:

void TimerManager::Turn(unsigned int pos)
    {
        for (auto iter = timeWheel[pos].begin(); iter != timeWheel[pos].end();) {
            if (iter->second[2]-- == 0) {
                Timer* timer = reinterpret_cast<Timer*>(iter->first);
                switch (static_cast<Mode>(iter->second[0])) {
                    case REL_LOOP: {
                        std::async(std::launch::async, &Timer::TimeOut, timer);  // 异步执行超时函数
                        iter->second[2] = iter->second[1];
                        iter++;
                    } break;
                    case REL_ONCE: {
                        std::async(std::launch::async, &Timer::TimeOut, timer);  // 异步执行超时函数
                        // 移除一次性相对定时器
                        timerMap.erase(iter->first);
                        iter = timeWheel[pos].erase(iter);
                    } break;
                    case ABS_ONCE: {
                        if (AbsTimerMap[iter->first] <= Now()) {
                            std::async(std::launch::async, &Timer::TimeOut, timer);  // 异步执行超时函数
                            // 移除绝对定时器
                            timerMap.erase(iter->first);
                            AbsTimerMap.erase(iter->first);
                            iter = timeWheel[pos].erase(iter);
                        }
                        else {
                            iter->second[2] = iter->second[1];
                            iter++;
                        }
                    }
                    default: break;
                }
            }
            else {
                iter++;
            }
        }
    }